

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O0

char * __thiscall GEO::Delaunay::index(Delaunay *this,char *__s,int __c)

{
  uint uVar1;
  index_t iVar2;
  signed_index_t sVar3;
  allocator local_41;
  string local_40 [36];
  uint local_1c;
  int local_18;
  index_t iv;
  signed_index_t v_local;
  index_t c_local;
  Delaunay *this_local;
  
  iv = (index_t)__s;
  local_1c = 0;
  local_18 = __c;
  _v_local = this;
  while( true ) {
    uVar1 = local_1c;
    iVar2 = cell_size(this);
    if (iVar2 <= uVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_40,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.h"
                 ,&local_41);
      geo_should_not_have_reached((string *)local_40,0x19b0);
    }
    sVar3 = cell_vertex(this,iv,local_1c);
    if (sVar3 == local_18) break;
    local_1c = local_1c + 1;
  }
  return (char *)(ulong)local_1c;
}

Assistant:

index_t index(index_t c, signed_index_t v) const {
            geo_debug_assert(c < nb_cells());
            geo_debug_assert(v < (signed_index_t) nb_vertices());
            for(index_t iv = 0; iv < cell_size(); iv++) {
                if(cell_vertex(c, iv) == v) {
                    return iv;
                }
            }
            geo_assert_not_reached;
        }